

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O0

int ly_clean_plugins(void)

{
  int local_10;
  uint local_c;
  int ret;
  uint u;
  
  local_10 = 0;
  pthread_mutex_lock((pthread_mutex_t *)&plugins_lock);
  plugin_refs = plugin_refs - 1;
  if (plugin_refs == 0) {
    if ((ext_plugins_count != 0) || (type_plugins_count != 0)) {
      free(ext_plugins);
      ext_plugins = (lyext_plugin_list *)0x0;
      ext_plugins_count = 0;
      free(type_plugins);
      type_plugins = (lytype_plugin_list *)0x0;
      type_plugins_count = 0;
      for (local_c = 0; local_c < loaded_plugins_count; local_c = local_c + 1) {
        free(loaded_plugins[local_c]);
      }
      free(loaded_plugins);
      loaded_plugins = (char **)0x0;
      loaded_plugins_count = 0;
      for (local_c = 0; local_c < dlhandlers.number; local_c = local_c + 1) {
        dlclose(dlhandlers.set.s[local_c]);
      }
      free(dlhandlers.set.s);
      dlhandlers.set.s = (lys_node **)0x0;
      dlhandlers.size = 0;
      dlhandlers.number = 0;
    }
  }
  else {
    local_10 = 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&plugins_lock);
  return local_10;
}

Assistant:

API int
ly_clean_plugins(void)
{
    unsigned int u;
    int ret = EXIT_SUCCESS;

#ifdef STATIC
    /* lock the extension plugins list */
    pthread_mutex_lock(&plugins_lock);

    if(ext_plugins) {
        free(ext_plugins);
        ext_plugins = NULL;
        ext_plugins_count = 0;
    }

    if(type_plugins) {
        free(type_plugins);
        type_plugins = NULL;
        type_plugins_count = 0;
    }

    for (u = 0; u < loaded_plugins_count; ++u) {
        free(loaded_plugins[u]);
    }
    free(loaded_plugins);
    loaded_plugins = NULL;
    loaded_plugins_count = 0;

    /* unlock the global structures */
    pthread_mutex_unlock(&plugins_lock);
    return ret;
#endif /* STATIC */

    /* lock the extension plugins list */
    pthread_mutex_lock(&plugins_lock);

    if (--plugin_refs) {
        /* there is a context that may refer to the plugins, so we cannot remove them */
        ret = EXIT_FAILURE;
        goto cleanup;
    }

    if (!ext_plugins_count && !type_plugins_count) {
        /* no plugin loaded - nothing to do */
        goto cleanup;
    }

    /* clean the lists */
    free(ext_plugins);
    ext_plugins = NULL;
    ext_plugins_count = 0;

    free(type_plugins);
    type_plugins = NULL;
    type_plugins_count = 0;

    for (u = 0; u < loaded_plugins_count; ++u) {
        free(loaded_plugins[u]);
    }
    free(loaded_plugins);
    loaded_plugins = NULL;
    loaded_plugins_count = 0;

    /* close the dl handlers */
    for (u = 0; u < dlhandlers.number; u++) {
        dlclose(dlhandlers.set.g[u]);
    }
    free(dlhandlers.set.g);
    dlhandlers.set.g = NULL;
    dlhandlers.size = 0;
    dlhandlers.number = 0;

cleanup:
    /* unlock the global structures */
    pthread_mutex_unlock(&plugins_lock);

    return ret;
}